

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

void parse_escapes(char *src,mtree_entry *mentry)

{
  int iVar1;
  mtree_entry *pmVar2;
  byte local_21;
  byte *pbStack_20;
  char c;
  char *dest;
  mtree_entry *mentry_local;
  char *src_local;
  
  pbStack_20 = (byte *)src;
  mentry_local = (mtree_entry *)src;
  if ((mentry != (mtree_entry *)0x0) && (iVar1 = strcmp(src,"."), iVar1 == 0)) {
    mentry->full = '\x01';
  }
  do {
    if (*(char *)(mentry_local->rbnode).rb_nodes == '\0') {
      *pbStack_20 = 0;
      return;
    }
    pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 1);
    local_21 = *(byte *)(mentry_local->rbnode).rb_nodes;
    if ((local_21 == 0x2f) && (mentry != (mtree_entry *)0x0)) {
      mentry->full = '\x01';
    }
    if (local_21 == 0x5c) {
      switch(*(undefined1 *)(pmVar2->rbnode).rb_nodes) {
      case 0x30:
        if (('/' < *(char *)((long)(mentry_local->rbnode).rb_nodes + 2)) &&
           (*(char *)((long)(mentry_local->rbnode).rb_nodes + 2) < '8'))
        goto switchD_00605d32_caseD_31;
        local_21 = 0;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x31:
      case 0x32:
      case 0x33:
switchD_00605d32_caseD_31:
        if (('/' < *(char *)((long)(mentry_local->rbnode).rb_nodes + 2)) &&
           (((*(char *)((long)(mentry_local->rbnode).rb_nodes + 2) < '8' &&
             ('/' < *(char *)((long)(mentry_local->rbnode).rb_nodes + 3))) &&
            (*(char *)((long)(mentry_local->rbnode).rb_nodes + 3) < '8')))) {
          local_21 = *(char *)(pmVar2->rbnode).rb_nodes * '@' |
                     (*(char *)((long)(mentry_local->rbnode).rb_nodes + 2) + -0x30) * '\b' |
                     *(char *)((long)(mentry_local->rbnode).rb_nodes + 3) - 0x30U;
          pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 4);
        }
        break;
      case 0x5c:
        local_21 = 0x5c;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x61:
        local_21 = 7;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x62:
        local_21 = 8;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x66:
        local_21 = 0xc;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x6e:
        local_21 = 10;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x72:
        local_21 = 0xd;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x73:
        local_21 = 0x20;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x74:
        local_21 = 9;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
        break;
      case 0x76:
        local_21 = 0xb;
        pmVar2 = (mtree_entry *)((long)(mentry_local->rbnode).rb_nodes + 2);
      }
      mentry_local = pmVar2;
      pmVar2 = mentry_local;
    }
    mentry_local = pmVar2;
    *pbStack_20 = local_21;
    pbStack_20 = pbStack_20 + 1;
  } while( true );
}

Assistant:

static void
parse_escapes(char *src, struct mtree_entry *mentry)
{
	char *dest = src;
	char c;

	if (mentry != NULL && strcmp(src, ".") == 0)
		mentry->full = 1;

	while (*src != '\0') {
		c = *src++;
		if (c == '/' && mentry != NULL)
			mentry->full = 1;
		if (c == '\\') {
			switch (src[0]) {
			case '0':
				if (src[1] < '0' || src[1] > '7') {
					c = 0;
					++src;
					break;
				}
				/* FALLTHROUGH */
			case '1':
			case '2':
			case '3':
				if (src[1] >= '0' && src[1] <= '7' &&
				    src[2] >= '0' && src[2] <= '7') {
					c = (src[0] - '0') << 6;
					c |= (src[1] - '0') << 3;
					c |= (src[2] - '0');
					src += 3;
				}
				break;
			case 'a':
				c = '\a';
				++src;
				break;
			case 'b':
				c = '\b';
				++src;
				break;
			case 'f':
				c = '\f';
				++src;
				break;
			case 'n':
				c = '\n';
				++src;
				break;
			case 'r':
				c = '\r';
				++src;
				break;
			case 's':
				c = ' ';
				++src;
				break;
			case 't':
				c = '\t';
				++src;
				break;
			case 'v':
				c = '\v';
				++src;
				break;
			case '\\':
				c = '\\';
				++src;
				break;
			}
		}
		*dest++ = c;
	}
	*dest = '\0';
}